

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

void __thiscall NaPetriNet::link_nodes(NaPetriNet *this,NaPetriNode *pNode0,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar3;
  void **ppvVar4;
  uint uVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  NaPetriNode *this_00;
  char *fmt;
  undefined8 in_R8;
  undefined8 in_R9;
  NaPetriNode *this_01;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list val;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &val[0].overflow_arg_area;
  uVar5 = 0x10;
  if (pNode0 != (NaPetriNode *)0x0) {
    this_01 = (NaPetriNode *)0x0;
    local_e8[2] = (void *)in_RDX;
    local_e8[3] = (void *)in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    do {
      this_00 = pNode0;
      if (this_01 != (NaPetriNode *)0x0) {
        iVar1 = (*this_01->_vptr_NaPetriNode[9])(this_01);
        if (CONCAT44(extraout_var,iVar1) == 0) {
          pcVar3 = NaPetriNode::name(this_01);
          fmt = "Undefined mainstream output connector for node \'%s\'\n";
        }
        else {
          iVar1 = (*this_00->_vptr_NaPetriNode[8])(this_00);
          if (CONCAT44(extraout_var_00,iVar1) != 0) {
            iVar1 = (*this_01->_vptr_NaPetriNode[9])(this_01);
            iVar2 = (*this_00->_vptr_NaPetriNode[8])(this_00);
            (*this->_vptr_NaPetriNet[8])
                      (this,CONCAT44(extraout_var_01,iVar1),CONCAT44(extraout_var_02,iVar2));
            goto LAB_001469e0;
          }
          pcVar3 = NaPetriNode::name(this_00);
          fmt = "Undefined mainstream input connector for node \'%s\'\n";
        }
        NaPrintLog(fmt,pcVar3);
      }
LAB_001469e0:
      uVar6 = (ulong)uVar5;
      if (uVar6 < 0x29) {
        uVar5 = uVar5 + 8;
        ppvVar4 = (void **)((long)local_e8 + uVar6);
      }
      else {
        ppvVar4 = local_100;
        local_100 = local_100 + 1;
      }
      pNode0 = (NaPetriNode *)*ppvVar4;
      this_01 = this_00;
    } while ((NaPetriNode *)*ppvVar4 != (NaPetriNode *)0x0);
  }
  return;
}

Assistant:

void
NaPetriNet::link_nodes (NaPetriNode* pNode0, ...)
{
    NaPetriNode *pNodeCur, *pNodePrev;
    va_list     val;
    const char  *szExMsg =
        "Broken mainstream chain from '%s' to '%s' node.\n"
        "Caused by exception: %s\n";

    pNodePrev = NULL;
    pNodeCur = pNode0;

    for(va_start(val, pNode0);
        NULL != pNodeCur;
        pNodeCur = va_arg(val, NaPetriNode*)){

        // Link prev with current
        if(NULL != pNodePrev){
            try{
                if(NULL == pNodePrev->main_output_cn()){
                    NaPrintLog("Undefined mainstream output connector"
                               " for node '%s'\n", pNodePrev->name());
                }else if(NULL == pNodeCur->main_input_cn()){
                    NaPrintLog("Undefined mainstream input connector"
                               " for node '%s'\n", pNodeCur->name());
                }else{
                    link(pNodePrev->main_output_cn(),
                         pNodeCur->main_input_cn());
                }
            }catch(NaException exCode){
                NaPrintLog(szExMsg, pNodePrev->name(), pNodeCur->name(),
                           NaExceptionMsg(exCode));
            }
        }
        pNodePrev = pNodeCur;
    }

    va_end(val);
}